

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_cache.cc
# Opt level: O0

void __thiscall StorageCache::Close(StorageCache *this)

{
  bool bVar1;
  element_type *peVar2;
  long in_RDI;
  pair<long_long,_std::shared_ptr<StorageClient>_> element;
  iterator __end1;
  iterator __begin1;
  map<long_long,_std::shared_ptr<StorageClient>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_std::shared_ptr<StorageClient>_>_>_>
  *__range1;
  pair<const_long_long,_std::shared_ptr<StorageClient>_> *in_stack_ffffffffffffffb8;
  pair<long_long,_std::shared_ptr<StorageClient>_> *in_stack_ffffffffffffffc0;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = in_RDI + 8;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<long_long,_std::shared_ptr<StorageClient>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_std::shared_ptr<StorageClient>_>_>_>
       ::begin((map<long_long,_std::shared_ptr<StorageClient>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_std::shared_ptr<StorageClient>_>_>_>
                *)in_stack_ffffffffffffffb8);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<long_long,_std::shared_ptr<StorageClient>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_std::shared_ptr<StorageClient>_>_>_>
       ::end((map<long_long,_std::shared_ptr<StorageClient>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_std::shared_ptr<StorageClient>_>_>_>
              *)in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_long_long,_std::shared_ptr<StorageClient>_>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_long_long,_std::shared_ptr<StorageClient>_>_> *)
               0x170c94);
    std::pair<long_long,_std::shared_ptr<StorageClient>_>::
    pair<const_long_long,_std::shared_ptr<StorageClient>,_true>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    peVar2 = std::__shared_ptr_access<StorageClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<StorageClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x170cab);
    (*peVar2->_vptr_StorageClient[1])();
    std::pair<long_long,_std::shared_ptr<StorageClient>_>::~pair
              ((pair<long_long,_std::shared_ptr<StorageClient>_> *)0x170cc3);
    std::_Rb_tree_iterator<std::pair<const_long_long,_std::shared_ptr<StorageClient>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_long_long,_std::shared_ptr<StorageClient>_>_> *)
               in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void StorageCache::Close() {
  for (std::pair<long long, shared_ptr<StorageClient>> element : cache_) {
    element.second->Close();
  }
}